

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# craigtracer.cpp
# Opt level: O1

void __thiscall
CaDiCraig::CraigTracer::conclude_unsat
          (CraigTracer *this,ConclusionType conclusion,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *proof_chain)

{
  CraigData *pCVar1;
  int *piVar2;
  unsigned_long uVar3;
  pointer pvVar4;
  bool bVar5;
  size_t sVar6;
  undefined7 uVar7;
  uint8_t uVar8;
  uint uVar9;
  CraigData *result;
  int *l;
  int *piVar10;
  ulong uVar11;
  int *l_1;
  
  if (this->craig_interpolant != (CraigData *)0x0) {
    operator_delete(this->craig_interpolant,0x20);
    this->craig_interpolant = (CraigData *)0x0;
  }
  if (conclusion == CONSTRAINT) {
    piVar2 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar10 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar10 != piVar2; piVar10 = piVar10 + 1) {
      mark_literal(this,*piVar10);
    }
    result = create_interpolant_for_clause(this,&this->constraint,this->craig_constraint_label);
    uVar9 = (int)((ulong)((long)(proof_chain->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(proof_chain->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    if (-1 < (int)uVar9) {
      uVar11 = (ulong)uVar9;
      do {
        uVar3 = (proof_chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar11];
        pvVar4 = (this->craig_clauses).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar2 = *(pointer *)
                  ((long)&pvVar4[uVar3 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (piVar10 = pvVar4[uVar3 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar10 != piVar2; piVar10 = piVar10 + 1) {
          uVar8 = mark_literal(this,*piVar10);
          if (uVar8 != '\0') {
            extend_interpolant_with_resolution
                      (this,result,-*piVar10,
                       (this->craig_interpolants).
                       super__Vector_base<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(proof_chain->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar11] - 1]);
          }
        }
        bVar5 = 0 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar5);
    }
    unmark_all(this);
  }
  else if ((conclusion == ASSUMPTIONS) || (conclusion == CONFLICT)) {
    result = (CraigData *)::operator_new(0x20);
    pCVar1 = (this->craig_interpolants).
             super__Vector_base<CaDiCraig::CraigData_*,_std::allocator<CaDiCraig::CraigData_*>_>.
             _M_impl.super__Vector_impl_data._M_start
             [*(proof_chain->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start - 1];
    (result->partial_interpolant_sym).index = (pCVar1->partial_interpolant_sym).index;
    (result->partial_interpolant_asym).index = (pCVar1->partial_interpolant_asym).index;
    (result->partial_interpolant_dual_sym).index = (pCVar1->partial_interpolant_dual_sym).index;
    (result->partial_interpolant_dual_asym).index = (pCVar1->partial_interpolant_dual_asym).index;
    uVar7 = *(undefined7 *)&pCVar1->field_0x11;
    sVar6 = pCVar1->craig_id;
    result->clause_type = pCVar1->clause_type;
    *(undefined7 *)&result->field_0x11 = uVar7;
    result->craig_id = sVar6;
  }
  else {
    result = (CraigData *)0x0;
  }
  this->craig_interpolant = result;
  return;
}

Assistant:

void CraigTracer::conclude_unsat (
    CaDiCaL::ConclusionType conclusion,
    const std::vector<uint64_t> &proof_chain) {
  if (craig_interpolant) {
    delete craig_interpolant;
    craig_interpolant = 0;
  }

  CraigData *interpolant = 0;
  if (conclusion == CaDiCaL::ConclusionType::CONFLICT) {
    // There is a single global conflict.
    // The proof_chain contains a single empty clause.
    // chain = (c1), c1 = {}
    assert (proof_chain.size () == 1);
    assert (craig_clauses[proof_chain[0] - 1].empty ());
    interpolant = new CraigData (*craig_interpolants[proof_chain[0] - 1]);
  } else if (conclusion == CaDiCaL::ConclusionType::ASSUMPTIONS) {
    // One or more constraints are responsible for the conflict.
    // The proof_chain contains a single clause with failing assumptions.
    // The interpolant of that clause already has been resolved with
    // assumption interpolants. chain = (c1), c1 = { -a1, -a2, -a3, ... }
    assert (proof_chain.size () == 1);
    assert (craig_clauses[proof_chain[0] - 1].size () > 0);
    interpolant = new CraigData (*craig_interpolants[proof_chain[0] - 1]);
  } else if (conclusion == CaDiCaL::ConclusionType::CONSTRAINT) {
    // The constraint clause is responsible for the conflict.

    // Mark literals of conflicting clause.
    for (auto &l : constraint)
      mark_literal (l);

    // Find pivot literal of each clause that was resolved with
    // and extend Craig interpolant for it.
    interpolant =
        create_interpolant_for_clause (constraint, craig_constraint_label);
    for (int i = proof_chain.size () - 1; i >= 0; i--) {
      for (auto &l : craig_clauses[proof_chain[i] - 1]) {
        // Function mark_literal returns true if inverse literal was marked
        // before and marks literal l for the following resolvent literal
        // checks.
        if (!mark_literal (l))
          continue;

        extend_interpolant_with_resolution (
            *interpolant, -l, *craig_interpolants[proof_chain[i] - 1]);
      }
    }

    unmark_all ();
  } else {
    assert (false); // No conclusion given!
  }

  craig_interpolant = interpolant;
}